

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O2

void __thiscall gulcalc::gencovoutput(gulcalc *this,gulcoverageSampleslevel *gg)

{
  int iVar1;
  pointer pvVar2;
  uint in_EAX;
  pointer pfVar3;
  undefined8 uStack_18;
  
  if (this->coverageWriter_ != (_func_void_void_ptr_int_int *)0x0) {
    iVar1 = gg->coverage_id;
    pvVar2 = (this->cov_).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar3 = pvVar2[iVar1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar2[iVar1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data + 8) == pfVar3) {
      uStack_18 = (ulong)in_EAX;
      std::vector<float,_std::allocator<float>_>::resize
                (pvVar2 + iVar1,(long)this->samplesize_ + 3,
                 (value_type_conflict *)((long)&uStack_18 + 4));
      pfVar3 = (this->cov_).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[gg->coverage_id].
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
    pfVar3[(long)gg->sidx + 2] = gg->loss + pfVar3[(long)gg->sidx + 2];
  }
  return;
}

Assistant:

void gulcalc::gencovoutput(gulcoverageSampleslevel &gg)
{
	if (coverageWriter_ == 0)  return;
	if (cov_[gg.coverage_id].size() == 0) {
		cov_[gg.coverage_id].resize(samplesize_ + 3, 0);
	}
	cov_[gg.coverage_id][gg.sidx + 2] += gg.loss;
}